

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall
MutableS2ShapeIndex::RemoveShape
          (MutableS2ShapeIndex *this,RemovedShape *removed,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *all_edges,InteriorTracker *tracker)

{
  bool bVar1;
  reference __src;
  Edge *removed_edge;
  const_iterator __end1;
  const_iterator __begin1;
  vector<S2Shape::Edge,_std::allocator<S2Shape::Edge>_> *__range1;
  FaceEdge edge;
  InteriorTracker *tracker_local;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
  *all_edges_local;
  RemovedShape *removed_local;
  MutableS2ShapeIndex *this_local;
  
  edge.edge.v1.c_[2] = (VType)tracker;
  FaceEdge::FaceEdge((FaceEdge *)&__range1);
  __range1._4_4_ = 0xffffffff;
  __range1._0_4_ = removed->shape_id;
  edge.edge_id._0_1_ = removed->has_interior & 1;
  if ((byte)edge.edge_id != 0) {
    InteriorTracker::AddShape
              ((InteriorTracker *)edge.edge.v1.c_[2],(int32)__range1,
               (bool)(removed->contains_tracker_origin & 1));
  }
  __end1 = std::vector<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>::begin(&removed->edges);
  removed_edge = (Edge *)std::vector<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>::end
                                   (&removed->edges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_S2Shape::Edge_*,_std::vector<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>_>
                                *)&removed_edge);
    if (!bVar1) break;
    __src = __gnu_cxx::
            __normal_iterator<const_S2Shape::Edge_*,_std::vector<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>_>
            ::operator*(&__end1);
    memcpy(edge.b.c_ + 1,__src,0x30);
    edge.shape_id = GetEdgeMaxLevel(this,(Edge *)(edge.b.c_ + 1));
    AddFaceEdge(this,(FaceEdge *)&__range1,all_edges);
    __gnu_cxx::
    __normal_iterator<const_S2Shape::Edge_*,_std::vector<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::RemoveShape(const RemovedShape& removed,
                                      vector<FaceEdge> all_edges[6],
                                      InteriorTracker* tracker) const {
  FaceEdge edge;
  edge.edge_id = -1;  // Not used or needed for removed edges.
  edge.shape_id = removed.shape_id;
  edge.has_interior = removed.has_interior;
  if (edge.has_interior) {
    tracker->AddShape(edge.shape_id, removed.contains_tracker_origin);
  }
  for (const auto& removed_edge : removed.edges) {
    edge.edge = removed_edge;
    edge.max_level = GetEdgeMaxLevel(edge.edge);
    AddFaceEdge(&edge, all_edges);
  }
}